

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeBasicComputeShaderTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::compute::anon_unknown_0::ImageAtomicOpTestInstance::iterate
          (TestStatus *__return_storage_ptr__,ImageAtomicOpTestInstance *this)

{
  VkDeviceSize bufferSize;
  VkDeviceSize bufferSize_00;
  uint uVar1;
  void *pvVar2;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *this_00;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  VkImageSubresourceRange subresourceRange_01;
  Allocation *pAVar3;
  deUint32 queueFamilyIndex;
  deUint32 dVar4;
  DeviceInterface *vk;
  VkDevice device;
  Allocator *allocator;
  DescriptorSetLayoutBuilder *pDVar5;
  DescriptorPoolBuilder *pDVar6;
  DescriptorSetUpdateBuilder *pDVar7;
  const_iterator cVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  VkExtent3D extent;
  VkImageMemoryBarrier imagePreCopyBarrier;
  Move<vk::Handle<(vk::HandleType)24>_> local_518;
  long local_4f8;
  long *plStack_4f0;
  pointer local_4e8;
  VkAllocationCallbacks *pVStack_4e0;
  VkQueue local_4d0;
  VkPipelineLayout local_4c8;
  Deleter<vk::Handle<(vk::HandleType)16>_> DStack_4c0;
  VkDescriptorSetLayout local_4a8;
  Deleter<vk::Handle<(vk::HandleType)19>_> DStack_4a0;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined4 local_478;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined4 local_458;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined4 local_438;
  VkCommandPool local_428;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_420;
  VkPipeline local_408;
  Deleter<vk::Handle<(vk::HandleType)18>_> DStack_400;
  VkShaderModule local_3e8;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_3e0;
  VkDescriptorPool local_3c8;
  Deleter<vk::Handle<(vk::HandleType)21>_> DStack_3c0;
  VkImageView local_3a8;
  Deleter<vk::Handle<(vk::HandleType)13>_> DStack_3a0;
  Buffer local_388;
  VkDescriptorBufferInfo bufferDescriptorInfo;
  VkDescriptorImageInfo imageDescriptorInfo;
  Buffer local_328;
  Image local_2f8;
  Random rnd;
  pointer local_2b8;
  VkDescriptorPool VStack_2b0;
  VkImage local_2a0;
  pointer local_298;
  pointer local_288;
  ios_base local_258 [264];
  Move<vk::VkCommandBuffer_s_*> local_150;
  VkBufferImageCopy copyParams;
  VkBufferMemoryBarrier outputBufferPostCopyBarrier;
  VkBufferMemoryBarrier inputBufferPostHostWriteBarrier;
  VkImageCreateInfo imageParams;
  
  vk = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device = Context::getDevice((this->super_TestInstance).m_context);
  local_4d0 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  allocator = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  imageParams.extent._0_8_ = *(undefined8 *)(this->m_imageSize).m_data;
  imageParams.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  imageParams.pNext = (void *)0x0;
  imageParams.flags = 0;
  imageParams.imageType = VK_IMAGE_TYPE_2D;
  imageParams.format = VK_FORMAT_R32_UINT;
  imageParams.extent.depth = 1;
  imageParams.mipLevels = 1;
  imageParams.arrayLayers = 1;
  imageParams.samples = VK_SAMPLE_COUNT_1_BIT;
  imageParams.tiling = VK_IMAGE_TILING_OPTIMAL;
  imageParams.usage = 9;
  imageParams.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  imageParams.queueFamilyIndexCount = 0;
  imageParams.pQueueFamilyIndices = (deUint32 *)0x0;
  imageParams.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  Image::Image(&local_2f8,vk,device,allocator,&imageParams,(MemoryRequirement)0x0);
  local_448 = 1;
  uStack_440 = 1;
  local_438 = 1;
  subresourceRange.levelCount = 1;
  subresourceRange.baseArrayLayer = 0;
  subresourceRange.aspectMask = 1;
  subresourceRange.baseMipLevel = 0;
  subresourceRange.layerCount = 1;
  makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&rnd,vk,device,
                (VkImage)local_2f8.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                         object.m_internal,VK_IMAGE_VIEW_TYPE_2D,VK_FORMAT_R32_UINT,subresourceRange
               );
  DStack_3a0.m_device = (VkDevice)local_2b8;
  DStack_3a0.m_allocator = (VkAllocationCallbacks *)VStack_2b0.m_internal;
  local_3a8.m_internal._0_4_ = rnd.m_rnd.x;
  local_3a8.m_internal._4_4_ = rnd.m_rnd.y;
  DStack_3a0.m_deviceIface = (DeviceInterface *)rnd.m_rnd._8_8_;
  uVar11 = (this->m_imageSize).m_data[1] * (this->m_imageSize).m_data[0] * this->m_localSize;
  bufferSize = (ulong)uVar11 * 4;
  makeBufferCreateInfo((VkBufferCreateInfo *)&rnd,bufferSize,0x20);
  compute::Buffer::Buffer
            (&local_388,vk,device,allocator,(VkBufferCreateInfo *)&rnd,(MemoryRequirement)0x1);
  deRandom_init(&rnd.m_rnd,0x77238ac2);
  pAVar3 = local_388.m_allocation.
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  if (uVar11 != 0) {
    pvVar2 = (local_388.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_hostPtr;
    lVar10 = 0;
    do {
      dVar4 = deRandom_getUint32(&rnd.m_rnd);
      *(deUint32 *)((long)pvVar2 + lVar10 * 4) = dVar4;
      lVar10 = lVar10 + 1;
    } while (uVar11 != (uint)lVar10);
  }
  ::vk::flushMappedMemoryRange
            (vk,device,(VkDeviceMemory)(pAVar3->m_memory).m_internal,pAVar3->m_offset,bufferSize);
  uVar11 = (this->m_imageSize).m_data[1] * (this->m_imageSize).m_data[0];
  bufferSize_00 = (ulong)uVar11 * 4;
  makeBufferCreateInfo((VkBufferCreateInfo *)&rnd,bufferSize_00,2);
  compute::Buffer::Buffer
            (&local_328,vk,device,allocator,(VkBufferCreateInfo *)&rnd,(MemoryRequirement)0x1);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder((DescriptorSetLayoutBuilder *)&rnd);
  pDVar5 = ::vk::DescriptorSetLayoutBuilder::addBinding
                     ((DescriptorSetLayoutBuilder *)&rnd,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1,0x20,
                      (VkSampler *)0x0);
  pDVar5 = ::vk::DescriptorSetLayoutBuilder::addBinding
                     (pDVar5,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,1,0x20,(VkSampler *)0x0);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&imagePreCopyBarrier,pDVar5,vk,device,0);
  DStack_4a0.m_device = (VkDevice)imagePreCopyBarrier._16_8_;
  DStack_4a0.m_allocator = (VkAllocationCallbacks *)imagePreCopyBarrier._24_8_;
  local_4a8.m_internal = imagePreCopyBarrier._0_8_;
  DStack_4a0.m_deviceIface = (DeviceInterface *)imagePreCopyBarrier.pNext;
  imagePreCopyBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imagePreCopyBarrier._4_4_ = 0;
  imagePreCopyBarrier.pNext = (void *)0x0;
  imagePreCopyBarrier.srcAccessMask = 0;
  imagePreCopyBarrier.dstAccessMask = 0;
  imagePreCopyBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  imagePreCopyBarrier.newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  if (local_298 != (pointer)0x0) {
    operator_delete(local_298,(long)local_288 - (long)local_298);
  }
  if ((VkAllocationCallbacks *)VStack_2b0.m_internal != (VkAllocationCallbacks *)0x0) {
    operator_delete((void *)VStack_2b0.m_internal,local_2a0.m_internal - VStack_2b0.m_internal);
  }
  if (rnd.m_rnd._0_8_ != 0) {
    operator_delete((void *)rnd.m_rnd._0_8_,(long)local_2b8 - rnd.m_rnd._0_8_);
  }
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&imagePreCopyBarrier);
  pDVar6 = ::vk::DescriptorPoolBuilder::addType
                     ((DescriptorPoolBuilder *)&imagePreCopyBarrier,
                      VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  pDVar6 = ::vk::DescriptorPoolBuilder::addType(pDVar6,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,1);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&rnd,pDVar6,vk,device,1,1);
  DStack_3c0.m_device = (VkDevice)local_2b8;
  DStack_3c0.m_allocator = (VkAllocationCallbacks *)VStack_2b0.m_internal;
  local_3c8.m_internal._0_4_ = rnd.m_rnd.x;
  local_3c8.m_internal._4_4_ = rnd.m_rnd.y;
  DStack_3c0.m_deviceIface = (DeviceInterface *)rnd.m_rnd._8_8_;
  rnd.m_rnd.x = 0;
  rnd.m_rnd.y = 0;
  rnd.m_rnd.z = 0;
  rnd.m_rnd.w = 0;
  local_2b8 = (pointer)0x0;
  VStack_2b0.m_internal = 0;
  if (imagePreCopyBarrier._0_8_ != 0) {
    operator_delete((void *)imagePreCopyBarrier._0_8_,
                    imagePreCopyBarrier._16_8_ - imagePreCopyBarrier._0_8_);
  }
  makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&rnd,vk,device,local_3c8,local_4a8);
  local_4e8 = local_2b8;
  pVStack_4e0 = (VkAllocationCallbacks *)VStack_2b0.m_internal;
  local_4f8._0_4_ = rnd.m_rnd.x;
  local_4f8._4_4_ = rnd.m_rnd.y;
  plStack_4f0 = (long *)rnd.m_rnd._8_8_;
  bufferDescriptorInfo.buffer.m_internal =
       local_388.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  bufferDescriptorInfo.offset = 0;
  bufferDescriptorInfo.range = bufferSize;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder((DescriptorSetUpdateBuilder *)&rnd);
  pDVar7 = (DescriptorSetUpdateBuilder *)
           ::vk::DescriptorSetUpdateBuilder::write
                     ((DescriptorSetUpdateBuilder *)&rnd,(int)local_4f8,(void *)0x0,0);
  pDVar7 = (DescriptorSetUpdateBuilder *)
           ::vk::DescriptorSetUpdateBuilder::write(pDVar7,(int)local_4f8,&DAT_00000001,0);
  ::vk::DescriptorSetUpdateBuilder::update(pDVar7,vk,device);
  if (local_298 != (pointer)0x0) {
    operator_delete(local_298,(long)local_288 - (long)local_298);
  }
  if ((VkAllocationCallbacks *)VStack_2b0.m_internal != (VkAllocationCallbacks *)0x0) {
    operator_delete((void *)VStack_2b0.m_internal,local_2a0.m_internal - VStack_2b0.m_internal);
  }
  std::
  vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ::~vector((vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
             *)&rnd);
  this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
             *)((this->super_TestInstance).m_context)->m_progCollection;
  imagePreCopyBarrier._0_8_ = &imagePreCopyBarrier.srcAccessMask;
  std::__cxx11::string::_M_construct<char_const*>((string *)&imagePreCopyBarrier,"comp","");
  cVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find(this_00,(key_type *)&imagePreCopyBarrier);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&rnd,vk,device,
             *(ProgramBinary **)(cVar8._M_node + 2),0);
  DStack_3e0.m_device = (VkDevice)local_2b8;
  DStack_3e0.m_allocator = (VkAllocationCallbacks *)VStack_2b0.m_internal;
  local_3e8.m_internal._0_4_ = rnd.m_rnd.x;
  local_3e8.m_internal._4_4_ = rnd.m_rnd.y;
  DStack_3e0.m_deviceIface = (DeviceInterface *)rnd.m_rnd._8_8_;
  rnd.m_rnd.x = 0;
  rnd.m_rnd.y = 0;
  rnd.m_rnd.z = 0;
  rnd.m_rnd.w = 0;
  local_2b8 = (pointer)0x0;
  VStack_2b0.m_internal = 0;
  if ((VkAccessFlags *)imagePreCopyBarrier._0_8_ != &imagePreCopyBarrier.srcAccessMask) {
    operator_delete((void *)imagePreCopyBarrier._0_8_,imagePreCopyBarrier._16_8_ + 1);
  }
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&rnd,vk,device,local_4a8);
  DStack_4c0.m_device = (VkDevice)local_2b8;
  DStack_4c0.m_allocator = (VkAllocationCallbacks *)VStack_2b0.m_internal;
  local_4c8.m_internal._0_4_ = rnd.m_rnd.x;
  local_4c8.m_internal._4_4_ = rnd.m_rnd.y;
  DStack_4c0.m_deviceIface = (DeviceInterface *)rnd.m_rnd._8_8_;
  makeComputePipeline((Move<vk::Handle<(vk::HandleType)18>_> *)&rnd,vk,device,
                      (VkPipelineLayout)rnd.m_rnd._0_8_,local_3e8);
  DStack_400.m_device = (VkDevice)local_2b8;
  DStack_400.m_allocator = (VkAllocationCallbacks *)VStack_2b0.m_internal;
  local_408.m_internal._0_4_ = rnd.m_rnd.x;
  local_408.m_internal._4_4_ = rnd.m_rnd.y;
  DStack_400.m_deviceIface = (DeviceInterface *)rnd.m_rnd._8_8_;
  makeBufferMemoryBarrier
            (&inputBufferPostHostWriteBarrier,0x4000,0x20,
             (VkBuffer)
             local_388.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,0,bufferSize);
  local_468 = 1;
  uStack_460 = 1;
  local_458 = 1;
  subresourceRange_00.levelCount = 1;
  subresourceRange_00.baseArrayLayer = 0;
  subresourceRange_00.aspectMask = 1;
  subresourceRange_00.baseMipLevel = 0;
  subresourceRange_00.layerCount = 1;
  makeImageMemoryBarrier
            ((VkImageMemoryBarrier *)&rnd,0,0x40,VK_IMAGE_LAYOUT_UNDEFINED,VK_IMAGE_LAYOUT_GENERAL,
             (VkImage)local_2f8.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                      m_internal,subresourceRange_00);
  local_488 = 1;
  uStack_480 = 1;
  local_478 = 1;
  subresourceRange_01.levelCount = 1;
  subresourceRange_01.baseArrayLayer = 0;
  subresourceRange_01.aspectMask = 1;
  subresourceRange_01.baseMipLevel = 0;
  subresourceRange_01.layerCount = 1;
  makeImageMemoryBarrier
            (&imagePreCopyBarrier,0x40,0x800,VK_IMAGE_LAYOUT_GENERAL,
             VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
             (VkImage)local_2f8.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                      m_internal,subresourceRange_01);
  dVar4 = 0;
  makeBufferMemoryBarrier
            (&outputBufferPostCopyBarrier,0x1000,0x2000,
             (VkBuffer)
             local_328.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,0,bufferSize_00);
  extent.depth = 1;
  extent.width = 1;
  extent.height = 0;
  makeBufferImageCopy(&copyParams,*(compute **)(this->m_imageSize).m_data,extent,dVar4);
  makeCommandPool(&local_518,vk,device,queueFamilyIndex);
  DStack_420.m_device =
       local_518.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device;
  DStack_420.m_allocator =
       local_518.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator;
  local_428.m_internal =
       local_518.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
  DStack_420.m_deviceIface =
       local_518.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface;
  ::vk::allocateCommandBuffer
            (&local_150,vk,device,
             (VkCommandPool)
             local_518.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  local_518.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
       local_150.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device;
  local_518.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       local_150.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal;
  local_518.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal =
       (deUint64)local_150.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
  local_518.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
       local_150.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface;
  beginCommandBuffer(vk,local_150.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  (*vk->_vptr_DeviceInterface[0x4c])
            (vk,local_150.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,1,
             local_408.m_internal);
  (*vk->_vptr_DeviceInterface[0x56])
            (vk,local_150.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,1,
             local_4c8.m_internal,0,1,&local_4f8,0,0);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,local_150.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0x4000,0x800,0,0,0,1,
             &inputBufferPostHostWriteBarrier,1,(int)&rnd);
  (*vk->_vptr_DeviceInterface[0x5d])
            (vk,local_150.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
             (ulong)(uint)(this->m_imageSize).m_data[0],(ulong)(uint)(this->m_imageSize).m_data[1],1
            );
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,local_150.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0x800,0x1000,0,0,0,0,
             0,1,(int)&imagePreCopyBarrier);
  (*vk->_vptr_DeviceInterface[99])
            (vk,local_150.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
             local_2f8.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
             m_internal,6,
             local_328.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,1,(int)&copyParams);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,local_150.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0x1000,0x4000,0,0,0,1
             ,&outputBufferPostCopyBarrier,0,0);
  endCommandBuffer(vk,local_150.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  submitCommandsAndWait
            (vk,device,local_4d0,local_150.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  if (local_150.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object != (VkCommandBuffer)0x0) {
    (*(local_518.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface)->
      _vptr_DeviceInterface[0x48])
              (local_518.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface
               ,local_518.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device,
               local_518.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator,1
              );
  }
  if (local_428.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()(&DStack_420,local_428);
  }
  if (local_408.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()(&DStack_400,local_408);
  }
  if (local_4c8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()(&DStack_4c0,local_4c8);
  }
  if (local_3e8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_3e0,local_3e8);
  }
  pAVar3 = local_328.m_allocation.
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::invalidateMappedMemoryRange
            (vk,device,
             (VkDeviceMemory)
             ((local_328.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (local_328.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,bufferSize_00);
  if (uVar11 != 0) {
    uVar1 = this->m_localSize;
    uVar12 = 0;
    uVar9 = 0;
    do {
      iVar13 = 0;
      if ((ulong)uVar1 != 0) {
        iVar13 = 0;
        uVar14 = (ulong)uVar1;
        uVar15 = uVar12;
        do {
          iVar13 = iVar13 + *(int *)((long)(local_388.m_allocation.
                                            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
                                            .m_data.ptr)->m_hostPtr + (ulong)uVar15 * 4);
          uVar15 = uVar15 + 1;
          uVar14 = uVar14 - 1;
        } while (uVar14 != 0);
      }
      if (*(int *)((long)pAVar3->m_hostPtr + (ulong)uVar9 * 4) != iVar13) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&rnd);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&rnd,"Comparison failed for pixel ",0x1c);
        std::ostream::_M_insert<unsigned_long>((ulong)&rnd);
        std::__cxx11::stringbuf::str();
        __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
        (__return_storage_ptr__->m_description)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->m_description,imagePreCopyBarrier._0_8_,
                   (long)imagePreCopyBarrier.pNext + imagePreCopyBarrier._0_8_);
        if ((VkAccessFlags *)imagePreCopyBarrier._0_8_ != &imagePreCopyBarrier.srcAccessMask) {
          operator_delete((void *)imagePreCopyBarrier._0_8_,imagePreCopyBarrier._16_8_ + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&rnd);
        std::ios_base::~ios_base(local_258);
        goto LAB_006ee94b;
      }
      uVar9 = uVar9 + 1;
      uVar12 = uVar12 + uVar1;
    } while (uVar9 != uVar11);
  }
  rnd.m_rnd._0_8_ = &local_2b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&rnd,"Compute succeeded","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,rnd.m_rnd._0_8_,
             rnd.m_rnd._8_8_ + rnd.m_rnd._0_8_);
  if ((pointer *)rnd.m_rnd._0_8_ != &local_2b8) {
    operator_delete((void *)rnd.m_rnd._0_8_,
                    (ulong)((long)&(local_2b8->imageInfos).
                                   super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 1));
  }
LAB_006ee94b:
  if (local_4f8 != 0) {
    rnd.m_rnd.x = (undefined4)local_4f8;
    rnd.m_rnd.y = local_4f8._4_4_;
    (**(code **)(*plStack_4f0 + 0x1e8))(plStack_4f0,local_4e8,pVStack_4e0,1);
  }
  if (local_3c8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()(&DStack_3c0,local_3c8);
  }
  if (local_4a8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()(&DStack_4a0,local_4a8);
  }
  if (local_328.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0
     ) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&local_328.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               local_328.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  local_328.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  local_328.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  local_328.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  local_328.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  if (local_328.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
      m_data.ptr != (Allocation *)0x0) {
    (*(local_328.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
       m_data.ptr)->_vptr_Allocation[1])();
  }
  if (local_388.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0
     ) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&local_388.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               local_388.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  local_388.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  local_388.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  local_388.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  local_388.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  if (local_388.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
      m_data.ptr != (Allocation *)0x0) {
    (*(local_388.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
       m_data.ptr)->_vptr_Allocation[1])();
  }
  if (local_3a8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()(&DStack_3a0,local_3a8);
  }
  if (local_2f8.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal != 0)
  {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&local_2f8.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,
               (VkImage)local_2f8.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                        object.m_internal);
  }
  local_2f8.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  local_2f8.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  local_2f8.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
  local_2f8.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  if (local_2f8.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
      m_data.ptr != (Allocation *)0x0) {
    (*(local_2f8.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
       m_data.ptr)->_vptr_Allocation[1])();
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus ImageAtomicOpTestInstance::iterate (void)
{
	const DeviceInterface&	vk					= m_context.getDeviceInterface();
	const VkDevice			device				= m_context.getDevice();
	const VkQueue			queue				= m_context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
	Allocator&				allocator			= m_context.getDefaultAllocator();

	// Create an image

	const VkImageCreateInfo imageParams = make2DImageCreateInfo(m_imageSize, VK_IMAGE_USAGE_TRANSFER_SRC_BIT | VK_IMAGE_USAGE_STORAGE_BIT);
	const Image image(vk, device, allocator, imageParams, MemoryRequirement::Any);

	const VkImageSubresourceRange subresourceRange = makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, 1u);
	const Unique<VkImageView> imageView(makeImageView(vk, device, *image, VK_IMAGE_VIEW_TYPE_2D, VK_FORMAT_R32_UINT, subresourceRange));

	// Input buffer

	const deUint32 numInputValues = multiplyComponents(m_imageSize) * m_localSize;
	const VkDeviceSize inputBufferSizeBytes = sizeof(deUint32) * numInputValues;

	const Buffer inputBuffer(vk, device, allocator, makeBufferCreateInfo(inputBufferSizeBytes, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);

	// Populate the input buffer with test data
	{
		de::Random rnd(0x77238ac2);
		const Allocation& inputBufferAllocation = inputBuffer.getAllocation();
		deUint32* bufferPtr = static_cast<deUint32*>(inputBufferAllocation.getHostPtr());
		for (deUint32 i = 0; i < numInputValues; ++i)
			*bufferPtr++ = rnd.getUint32();

		flushMappedMemoryRange(vk, device, inputBufferAllocation.getMemory(), inputBufferAllocation.getOffset(), inputBufferSizeBytes);
	}

	// Create a buffer to store shader output (copied from image data)

	const deUint32 imageArea = multiplyComponents(m_imageSize);
	const VkDeviceSize outputBufferSizeBytes = sizeof(deUint32) * imageArea;
	const Buffer outputBuffer(vk, device, allocator, makeBufferCreateInfo(outputBufferSizeBytes, VK_BUFFER_USAGE_TRANSFER_DST_BIT), MemoryRequirement::HostVisible);

	// Create descriptor set

	const Unique<VkDescriptorSetLayout> descriptorSetLayout(
		DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, VK_SHADER_STAGE_COMPUTE_BIT)
		.build(vk, device));

	const Unique<VkDescriptorPool> descriptorPool(
		DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const Unique<VkDescriptorSet> descriptorSet(makeDescriptorSet(vk, device, *descriptorPool, *descriptorSetLayout));

	// Set the bindings

	const VkDescriptorImageInfo imageDescriptorInfo = makeDescriptorImageInfo(DE_NULL, *imageView, VK_IMAGE_LAYOUT_GENERAL);
	const VkDescriptorBufferInfo bufferDescriptorInfo = makeDescriptorBufferInfo(*inputBuffer, 0ull, inputBufferSizeBytes);

	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &bufferDescriptorInfo)
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(1u), VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, &imageDescriptorInfo)
		.update(vk, device);

	// Perform the computation
	{
		const Unique<VkShaderModule> shaderModule(createShaderModule(vk, device, m_context.getBinaryCollection().get("comp"), 0u));
		const Unique<VkPipelineLayout> pipelineLayout(makePipelineLayout(vk, device, *descriptorSetLayout));
		const Unique<VkPipeline> pipeline(makeComputePipeline(vk, device, *pipelineLayout, *shaderModule));

		const VkBufferMemoryBarrier inputBufferPostHostWriteBarrier = makeBufferMemoryBarrier(VK_ACCESS_HOST_WRITE_BIT, VK_ACCESS_SHADER_READ_BIT, *inputBuffer, 0ull, inputBufferSizeBytes);

		const VkImageMemoryBarrier imageLayoutBarrier = makeImageMemoryBarrier(
			(VkAccessFlags)0, VK_ACCESS_SHADER_WRITE_BIT,
			VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_GENERAL,
			*image, subresourceRange);

		const VkImageMemoryBarrier imagePreCopyBarrier = makeImageMemoryBarrier(
			VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_TRANSFER_READ_BIT,
			VK_IMAGE_LAYOUT_GENERAL, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
			*image, subresourceRange);

		const VkBufferMemoryBarrier outputBufferPostCopyBarrier = makeBufferMemoryBarrier(VK_ACCESS_TRANSFER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *outputBuffer, 0ull, outputBufferSizeBytes);

		const VkBufferImageCopy copyParams = makeBufferImageCopy(m_imageSize);

		// Prepare the command buffer

		const Unique<VkCommandPool> cmdPool(makeCommandPool(vk, device, queueFamilyIndex));
		const Unique<VkCommandBuffer> cmdBuffer(allocateCommandBuffer(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

		// Start recording commands

		beginCommandBuffer(vk, *cmdBuffer);

		vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipeline);
		vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_HOST_BIT, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 1, &inputBufferPostHostWriteBarrier, 1, &imageLayoutBarrier);
		vk.cmdDispatch(*cmdBuffer, m_imageSize.x(), m_imageSize.y(), 1u);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 0, (const VkBufferMemoryBarrier*)DE_NULL, 1, &imagePreCopyBarrier);
		vk.cmdCopyImageToBuffer(*cmdBuffer, *image, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *outputBuffer, 1u, &copyParams);
		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 1, &outputBufferPostCopyBarrier, 0, (const VkImageMemoryBarrier*)DE_NULL);

		endCommandBuffer(vk, *cmdBuffer);

		// Wait for completion

		submitCommandsAndWait(vk, device, queue, *cmdBuffer);
	}

	// Validate the results

	const Allocation& outputBufferAllocation = outputBuffer.getAllocation();
	invalidateMappedMemoryRange(vk, device, outputBufferAllocation.getMemory(), outputBufferAllocation.getOffset(), outputBufferSizeBytes);

	const deUint32* bufferPtr = static_cast<deUint32*>(outputBufferAllocation.getHostPtr());
	const deUint32* refBufferPtr = static_cast<deUint32*>(inputBuffer.getAllocation().getHostPtr());

	for (deUint32 pixelNdx = 0; pixelNdx < imageArea; ++pixelNdx)
	{
		const deUint32	res = bufferPtr[pixelNdx];
		deUint32		ref = 0;

		for (deUint32 offs = 0; offs < m_localSize; ++offs)
			ref += refBufferPtr[pixelNdx * m_localSize + offs];

		if (res != ref)
		{
			std::ostringstream msg;
			msg << "Comparison failed for pixel " << pixelNdx;
			return tcu::TestStatus::fail(msg.str());
		}
	}
	return tcu::TestStatus::pass("Compute succeeded");
}